

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::keyPressEvent(QMenu *this,QKeyEvent *e)

{
  QMenuPrivate *this_00;
  QRect *pQVar1;
  QWidgetData *pQVar2;
  undefined1 *puVar3;
  bool bVar4;
  char16_t *pcVar5;
  QAction *pQVar6;
  bool bVar7;
  char cVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  QStyle *pQVar16;
  QAction *pQVar17;
  QMenuBar *pQVar18;
  qsizetype qVar19;
  QMenu *pQVar20;
  QWidget *pQVar21;
  QObject *pQVar22;
  long lVar23;
  ScrollDirection direction;
  int i_2;
  uint uVar24;
  int iVar25;
  Representation RVar26;
  Data *pDVar27;
  int c;
  ulong uVar28;
  ScrollLocation SVar29;
  int i_1;
  ulong uVar30;
  long lVar31;
  int i;
  int iVar32;
  long in_FS_OFFSET;
  QRect QVar33;
  QAction *local_90;
  QAction *local_88;
  int local_74;
  QAction *local_70;
  QKeySequence sequence;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QMenuPrivate::updateActionRects(this_00);
  iVar15 = *(int *)(e + 0x40);
  bVar7 = QWidget::isRightToLeft(&this->super_QWidget);
  if (!bVar7) {
    bVar7 = true;
    bVar4 = false;
    iVar32 = 0x1000015;
    switch(iVar15 + -0x1000001) {
    case 0:
      goto switchD_00425fea_caseD_0;
    case 1:
      goto switchD_00425fea_caseD_1;
    case 2:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      goto switchD_00425fea_caseD_2;
    case 3:
    case 4:
      goto switchD_00425fea_caseD_3;
    case 0xf:
      goto switchD_00425fea_caseD_f;
    case 0x10:
      goto switchD_00425fea_caseD_10;
    case 0x11:
      goto switchD_00425fea_caseD_13;
    case 0x12:
    case 0x14:
      goto switchD_00425fea_caseD_12;
    case 0x13:
      goto switchD_00425fea_caseD_11;
    case 0x15:
      goto switchD_00425fea_caseD_15;
    case 0x16:
      goto switchD_00425fea_caseD_16;
    default:
      goto switchD_00425fea_default;
    }
  }
  bVar7 = true;
  bVar4 = false;
  iVar32 = 0x1000015;
  switch(iVar15 + -0x1000001) {
  case 1:
switchD_00425fea_caseD_1:
    pQVar17 = this_00->currentAction;
    iVar32 = 0x1000013;
    if (pQVar17 != (QAction *)0x0) goto LAB_0042614e;
    goto LAB_0042635d;
  case 2:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    goto switchD_00425fea_caseD_2;
  case 3:
  case 4:
switchD_00425fea_caseD_3:
    if (this_00->currentAction == (QAction *)0x0) {
      QMenuPrivate::setFirstActionActive(this_00);
      break;
    }
    QMenuPrivate::setSyncAction(this_00);
    pQVar20 = QAction::menu<QMenu*>(this_00->currentAction);
    local_90 = this_00->currentAction;
    if (pQVar20 != (QMenu *)0x0) goto LAB_004264b4;
    goto LAB_00426c22;
  case 0xf:
switchD_00425fea_caseD_f:
    if (this_00->scroll == (QMenuScroller *)0x0) break;
LAB_0042634a:
    SVar29 = ScrollTop;
    goto LAB_00426353;
  case 0x10:
switchD_00425fea_caseD_10:
    if (this_00->scroll == (QMenuScroller *)0x0) break;
    goto LAB_0042612c;
  case 0x11:
switchD_00425fea_caseD_11:
    bVar4 = true;
    if (((this_00->currentAction == (QAction *)0x0) || (cVar8 = QAction::isEnabled(), cVar8 == '\0')
        ) || (pQVar20 = QAction::menu<QMenu*>(this_00->currentAction), pQVar20 == (QMenu *)0x0)) {
      bVar7 = false;
      goto switchD_00425fea_caseD_13;
    }
    local_90 = this_00->currentAction;
LAB_004264b4:
    QMenuPrivate::popupAction(this_00,local_90,0,true);
    break;
  case 0x12:
  case 0x14:
switchD_00425fea_caseD_12:
    iVar32 = iVar15;
  case 0:
switchD_00425fea_caseD_0:
    pQVar17 = this_00->currentAction;
    if (pQVar17 == (QAction *)0x0) {
      if (iVar32 == 0x1000015) {
        lVar31 = 0;
        for (uVar30 = 0; uVar30 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size;
            uVar30 = uVar30 + 1) {
          bVar7 = QRect::isNull((QRect *)((long)&(((this_00->actionRects).d.ptr)->x1).m_i + lVar31))
          ;
          if (!bVar7) {
            pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar30];
            bVar7 = QMenuPrivate::considerAction(this_00,pQVar17);
            if (bVar7) goto LAB_004263aa;
          }
          lVar31 = lVar31 + 0x10;
        }
      }
      else {
LAB_0042635d:
        uVar24 = (uint)(this_00->super_QWidgetPrivate).actions.d.size;
        do {
          do {
            uVar24 = uVar24 - 1;
            if ((int)uVar24 < 0) goto LAB_00426c9d;
            bVar7 = QRect::isNull((this_00->actionRects).d.ptr + (uVar24 & 0x7fffffff));
          } while (bVar7);
          pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar24 & 0x7fffffff];
          bVar7 = QMenuPrivate::considerAction(this_00,pQVar17);
        } while (!bVar7);
LAB_004263aa:
        SVar29 = ScrollStay;
LAB_004263b3:
        if (pQVar17 != (QAction *)0x0) {
LAB_004263bc:
          if ((this_00->scroll != (QMenuScroller *)0x0) && (SVar29 != ScrollStay)) {
            QBasicTimer::stop();
            QMenuPrivate::scrollMenu(this_00,pQVar17,SVar29,false);
          }
LAB_00426a87:
          QMenuPrivate::setCurrentAction(this_00,pQVar17,-1,SelectedFromKeyboard,false);
        }
      }
    }
    else {
LAB_0042614e:
      lVar31 = 0xc;
      iVar15 = 0;
      for (uVar30 = 0; uVar30 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size;
          uVar30 = uVar30 + 1) {
        if ((this_00->super_QWidgetPrivate).actions.d.ptr[uVar30] == pQVar17) {
          if (iVar32 == 0x1000013) {
            SVar29 = ScrollStay;
            goto LAB_0042619f;
          }
          pQVar1 = (this_00->actionRects).d.ptr;
          iVar32 = *(int *)((long)&(pQVar1->x1).m_i + lVar31);
          iVar11 = *(int *)((long)pQVar1 + lVar31 + -8);
          SVar29 = ScrollStay;
          goto LAB_00426539;
        }
        pQVar1 = (this_00->actionRects).d.ptr;
        iVar15 = ((iVar15 + *(int *)((long)&(pQVar1->x1).m_i + lVar31)) -
                 *(int *)((long)pQVar1 + lVar31 + -8)) + 1;
        lVar31 = lVar31 + 0x10;
      }
    }
    break;
  case 0x13:
switchD_00425fea_caseD_13:
    if ((this_00->currentAction == (QAction *)0x0) || (this_00->scroll != (QMenuScroller *)0x0)) {
LAB_004264f0:
      if (bVar4) goto switchD_00425fea_caseD_2;
      pDVar27 = (this_00->causedPopup).widget.wp.d;
      if ((pDVar27 == (Data *)0x0) || (*(int *)(pDVar27 + 4) == 0)) {
        pQVar22 = (QObject *)0x0;
      }
      else {
        pQVar22 = (this_00->causedPopup).widget.wp.value;
      }
      pQVar20 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar22);
      if (pQVar20 == (QMenu *)0x0) goto switchD_00425fea_caseD_2;
      local_58.d = (Data *)(this_00->causedPopup).widget.wp.d;
      local_58.ptr = (char16_t *)(this_00->causedPopup).widget.wp.value;
      if ((Data *)local_58.d != (Data *)0x0) {
        LOCK();
        *(int *)&((Data *)local_58.d)->field_0x0 = *(int *)&((Data *)local_58.d)->field_0x0 + 1;
        UNLOCK();
      }
      QMenuPrivate::hideMenu(this_00,this);
      bVar7 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
      if (bVar7) {
        QWidget::setFocus((QWidget *)local_58.ptr);
      }
      goto LAB_00426a1d;
    }
    QVar33 = QMenuPrivate::actionRect(this_00,this_00->currentAction);
    lVar31 = (long)QVar33._0_8_ >> 0x20;
    lVar23 = QVar33._8_8_ >> 0x20;
    if (bVar7) {
      pQVar17 = (QAction *)0x0;
      for (uVar30 = QVar33._0_8_ & 0xffffffff; (pQVar17 == (QAction *)0x0 && (0 < (int)uVar30));
          uVar30 = uVar30 - 1) {
        pQVar17 = QMenuPrivate::actionAt
                            (this_00,(QPoint)(((lVar23 + lVar31) / 2 << 0x20) + -1 + uVar30));
      }
      if (pQVar17 == (QAction *)0x0) goto LAB_004264f0;
    }
    else {
      RVar26 = QVar33.x2.m_i;
      pQVar17 = (QAction *)0x0;
      while( true ) {
        RVar26.m_i = RVar26.m_i + 1;
        if (pQVar17 != (QAction *)0x0) break;
        pQVar2 = (this->super_QWidget).data;
        if (((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1 <= RVar26.m_i) goto LAB_004264f0;
        pQVar17 = QMenuPrivate::actionAt
                            (this_00,(QPoint)((ulong)(uint)RVar26.m_i |
                                             (lVar23 + lVar31) / 2 << 0x20));
      }
    }
    goto LAB_00426a87;
  case 0x15:
switchD_00425fea_caseD_15:
    if ((this_00->currentAction != (QAction *)0x0) && (this_00->scroll != (QMenuScroller *)0x0)) {
      if ((this_00->scroll->scrollFlags & 1) == 0) goto LAB_0042634a;
      direction = ScrollUp;
LAB_00426a9e:
      QMenuPrivate::scrollMenu(this_00,direction,true,true);
    }
    break;
  case 0x16:
switchD_00425fea_caseD_16:
    if ((this_00->currentAction == (QAction *)0x0) || (this_00->scroll == (QMenuScroller *)0x0))
    break;
    if ((this_00->scroll->scrollFlags & 2) != 0) {
      direction = ScrollDown;
      goto LAB_00426a9e;
    }
LAB_0042612c:
    SVar29 = ScrollBottom;
LAB_00426353:
    QMenuPrivate::scrollMenu(this_00,SVar29,true);
    break;
  default:
switchD_00425fea_default:
    if (iVar15 == 0x20) {
      pQVar16 = QWidget::style(&this->super_QWidget);
      iVar15 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0xf,0,this,0);
      if (iVar15 != 0) goto switchD_00425fea_caseD_3;
    }
    else if (iVar15 == 0x1000023) {
      if ((this_00->field_0x421 & 4) == 0) {
        pQVar16 = QWidget::style(&this->super_QWidget);
        iVar15 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x12,0,this,0);
        if (iVar15 != 0) {
          QMenuPrivate::hideMenu(this_00,this);
          pQVar21 = QApplication::focusWidget();
          pQVar18 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar21->super_QObject);
          if (pQVar18 != (QMenuBar *)0x0) {
            QMenuBarPrivate::setKeyboardMode
                      (*(QMenuBarPrivate **)&(pQVar18->super_QWidget).field_0x8,false);
          }
        }
        break;
      }
    }
    else if ((iVar15 == 0x1000030) && (this_00->currentAction != (QAction *)0x0)) {
      QAction::whatsThis();
      pcVar5 = local_58.ptr;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if ((QWidget *)pcVar5 != (QWidget *)0x0) {
        QWhatsThis::enterWhatsThisMode();
        QMenuPrivate::activateAction(this_00,this_00->currentAction,Trigger,true);
        goto LAB_00426ca6;
      }
    }
switchD_00425fea_caseD_2:
    iVar15 = 0x46;
    cVar8 = QKeyEvent::matches((StandardKey)e);
    if (cVar8 == '\0') {
      iVar15 = QKeyEvent::modifiers();
      if ((((iVar15 == 0) || (iVar15 == 0x2000000)) || (iVar15 == 0x8000000)) ||
         ((iVar15 == 0x28000000 || (iVar15 == 0x20000000)))) {
        local_58.d = *(Data **)(e + 0x28);
        local_58.ptr = *(char16_t **)(e + 0x30);
        puVar3 = *(undefined1 **)(e + 0x38);
        if ((Data *)local_58.d != (Data *)0x0) {
          LOCK();
          *(int *)&((Data *)local_58.d)->field_0x0 = *(int *)&((Data *)local_58.d)->field_0x0 + 1;
          UNLOCK();
        }
        local_58.size = (qsizetype)puVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (puVar3 == (undefined1 *)0x1) {
          pQVar16 = QWidget::style(&this->super_QWidget);
          iVar15 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x42,0,this,0);
          if ((iVar15 == 0) || (iVar15 = QKeyEvent::modifiers(), iVar15 != 0)) {
            local_58.d = *(Data **)(e + 0x28);
            local_58.ptr = *(char16_t **)(e + 0x30);
            local_58.size = *(qsizetype *)(e + 0x38);
            if ((Data *)local_58.d != (Data *)0x0) {
              LOCK();
              *(int *)&((Data *)local_58.d)->field_0x0 =
                   *(int *)&((Data *)local_58.d)->field_0x0 + 1;
              UNLOCK();
            }
            sVar9 = QChar::toUpper((uint)(ushort)*local_58.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            lVar31 = 0;
            local_74 = 0;
            local_88 = (QAction *)0x0;
            local_70 = (QAction *)0x0;
            local_90 = (QAction *)0x0;
            for (uVar30 = 0; uVar30 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size;
                uVar30 = uVar30 + 1) {
              bVar7 = QRect::isNull((QRect *)((long)&(((this_00->actionRects).d.ptr)->x1).m_i +
                                             lVar31));
              if (!bVar7) {
                pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar30];
                cVar8 = QAction::isEnabled();
                if ((cVar8 != '\0') && (cVar8 = QAction::isSeparator(), cVar8 == '\0')) {
                  _sequence = &DAT_aaaaaaaaaaaaaaaa;
                  QAction::text();
                  QKeySequence::mnemonic((QString *)&sequence);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                  sVar10 = QKeySequence::operator[]((uint)&sequence);
                  pQVar6 = local_70;
                  if (sVar9 == sVar10) {
                    local_74 = local_74 + 1;
                    if (local_88 == (QAction *)0x0) {
                      local_88 = pQVar17;
                    }
                    pQVar6 = pQVar17;
                    if (pQVar17 != this_00->currentAction) {
                      if (local_70 == (QAction *)0x0) {
                        pQVar17 = local_90;
                      }
                      pQVar6 = local_70;
                      if (local_90 == (QAction *)0x0) {
                        local_90 = pQVar17;
                      }
                    }
                  }
                  local_70 = pQVar6;
                  QKeySequence::~QKeySequence(&sequence);
                }
              }
              lVar31 = lVar31 + 0x10;
            }
            if (local_74 < 1) goto LAB_00426c2b;
            if (local_90 == (QAction *)0x0) {
              local_90 = local_88;
            }
            if (local_70 == (QAction *)0x0) {
              local_90 = local_88;
            }
            bVar7 = local_74 != 1;
            if (!bVar7) {
              local_90 = local_88;
            }
          }
          else {
            QBasicTimer::start(&this_00->searchBufferTimer,(Duration)0x77359400,(QObject *)this);
            local_58.d = *(Data **)(e + 0x28);
            local_58.ptr = *(char16_t **)(e + 0x30);
            local_58.size = *(qsizetype *)(e + 0x38);
            if ((Data *)local_58.d != (Data *)0x0) {
              LOCK();
              *(int *)&((Data *)local_58.d)->field_0x0 =
                   *(int *)&((Data *)local_58.d)->field_0x0 + 1;
              UNLOCK();
            }
            QString::append((QString *)&this_00->searchBuffer);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            local_90 = (QAction *)0x0;
            iVar15 = 0;
            for (uVar30 = 0; uVar30 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size;
                uVar30 = uVar30 + 1) {
              bVar7 = QRect::isNull((this_00->actionRects).d.ptr + uVar30);
              if (!bVar7) {
                pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar30];
                local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QAction::text();
                iVar32 = 0;
                for (uVar28 = 0; uVar28 < (ulong)(this_00->searchBuffer).d.size; uVar28 = uVar28 + 1
                    ) {
                  qVar19 = QString::indexOf((QString *)&local_58,
                                            (QChar)(this_00->searchBuffer).d.ptr[uVar28],0,
                                            CaseInsensitive);
                  iVar32 = iVar32 + (uint)(qVar19 != -1);
                }
                if (iVar15 < iVar32) {
                  iVar15 = iVar32;
                  local_90 = pQVar17;
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              }
            }
            bVar7 = true;
          }
          if (local_90 != (QAction *)0x0) {
            if (this_00->scroll != (QMenuScroller *)0x0) {
              QMenuPrivate::scrollMenu(this_00,local_90,ScrollCenter,false);
            }
            QMenuPrivate::setCurrentAction(this_00,local_90,0,SelectedFromElsewhere,true);
            pQVar20 = QAction::menu<QMenu*>(local_90);
            if (!(bool)(pQVar20 != (QMenu *)0x0 | bVar7)) {
              QMenuPrivate::setSyncAction(this_00);
LAB_00426c22:
              QMenuPrivate::activateAction(this_00,local_90,Trigger,true);
            }
            break;
          }
        }
      }
LAB_00426c2b:
      pQVar21 = QMenuPrivate::topCausedWidget(this_00);
      pQVar22 = (QObject *)
                QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar21->super_QObject);
      if (pQVar22 != (QObject *)0x0) {
        lVar31 = *(long *)(*(long *)(pQVar22 + 8) + 0x288);
        if ((lVar31 == 0) || (*(int *)(lVar31 + 4) == 0)) {
          lVar31 = 0;
        }
        else {
          lVar31 = *(long *)(*(long *)(pQVar22 + 8) + 0x290);
        }
        QCoreApplication::sendEvent(pQVar22,(QEvent *)e);
        lVar23 = *(long *)(*(long *)(pQVar22 + 8) + 0x288);
        if ((lVar23 == 0) || (*(int *)(lVar23 + 4) == 0)) {
          lVar23 = 0;
        }
        else {
          lVar23 = *(long *)(*(long *)(pQVar22 + 8) + 0x290);
        }
        if (lVar23 != lVar31) break;
      }
      e[0xc] = (QKeyEvent)0x0;
      goto LAB_00426ca6;
    }
    if ((this_00->field_0x421 & 4) != 0) {
      QWidget::close(&this->super_QWidget,iVar15);
      goto LAB_00426ca6;
    }
    local_58.d = (Data *)(this_00->causedPopup).widget.wp.d;
    local_58.ptr = (char16_t *)(this_00->causedPopup).widget.wp.value;
    if ((Data *)local_58.d == (Data *)0x0) {
      pDVar27 = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)&((Data *)local_58.d)->field_0x0 = *(int *)&((Data *)local_58.d)->field_0x0 + 1;
      UNLOCK();
      pDVar27 = (Data *)local_58.d;
    }
    QMenuPrivate::hideMenu(this_00,this);
    if ((pDVar27 == (Data *)0x0) || (pQVar21 = (QWidget *)local_58.ptr, *(int *)(pDVar27 + 4) == 0))
    {
      pQVar21 = (QWidget *)0x0;
    }
    pQVar18 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar21->super_QObject);
    if (pQVar18 != (QMenuBar *)0x0) {
      QMenuBarPrivate::setCurrentAction
                (*(QMenuBarPrivate **)&(pQVar18->super_QWidget).field_0x8,this_00->menuAction,false,
                 false);
      QMenuBarPrivate::setKeyboardMode
                (*(QMenuBarPrivate **)&(pQVar18->super_QWidget).field_0x8,true);
    }
LAB_00426a1d:
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
  }
LAB_00426c9d:
  e[0xc] = (QKeyEvent)0x1;
LAB_00426ca6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
  while( true ) {
    iVar12 = (int)uVar30;
    pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[iVar12];
    if (pQVar17 == this_00->currentAction) goto LAB_00426c9d;
    bVar7 = QRect::isNull((this_00->actionRects).d.ptr + iVar12);
    if ((!bVar7) && (bVar7 = QMenuPrivate::considerAction(this_00,pQVar17), bVar7)) break;
LAB_00426539:
    uVar24 = (int)uVar30 + 1;
    uVar30 = (ulong)uVar24;
    if ((this_00->actionRects).d.size == (long)(int)uVar24) {
      pQVar16 = QWidget::style(&this->super_QWidget);
      iVar12 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x49,0,this);
      if (iVar12 == 0) goto LAB_00426c9d;
      if (this_00->scroll != (QMenuScroller *)0x0) {
        SVar29 = ScrollTop;
      }
      uVar30 = 0;
    }
  }
  if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 2) != 0)) {
    pQVar2 = (this->super_QWidget).data;
    iVar25 = (pQVar2->crect).y1.m_i;
    iVar14 = (pQVar2->crect).y2.m_i;
    iVar13 = QMenuPrivate::scrollerHeight(this_00);
    iVar25 = (iVar14 - (iVar13 + iVar25)) + 1;
    if ((this_00->scroll->scrollFlags & 1) != 0) {
      iVar14 = QMenuPrivate::scrollerHeight(this_00);
      iVar25 = iVar25 - iVar14;
    }
    if ((this_00->field_0x421 & 2) != 0) {
      pQVar16 = QWidget::style(&this->super_QWidget);
      iVar14 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1f,0,this);
      iVar25 = iVar25 - iVar14;
    }
    pQVar1 = (this_00->actionRects).d.ptr;
    if (iVar25 < ((((iVar15 + iVar32) - iVar11) + this_00->scroll->scrollOffset +
                  pQVar1[iVar12].y2.m_i) - pQVar1[iVar12].y1.m_i) + 2) {
      SVar29 = ScrollBottom;
    }
  }
  goto LAB_004263b3;
  while( true ) {
    uVar24 = iVar32 - 1;
    uVar30 = (ulong)uVar24;
    pQVar17 = (this_00->super_QWidgetPrivate).actions.d.ptr[(int)uVar24];
    if (pQVar17 == this_00->currentAction) goto LAB_004262af;
    bVar7 = QRect::isNull((this_00->actionRects).d.ptr + (int)uVar24);
    if ((!bVar7) && (bVar7 = QMenuPrivate::considerAction(this_00,pQVar17), bVar7)) break;
LAB_0042619f:
    iVar32 = (int)uVar30;
    if (iVar32 == 0) {
      pQVar16 = QWidget::style(&this->super_QWidget);
      iVar32 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x49,0,this);
      if (iVar32 == 0) goto LAB_004262af;
      if (this_00->scroll != (QMenuScroller *)0x0) {
        SVar29 = ScrollBottom;
      }
      iVar32 = (int)(this_00->actionRects).d.size;
    }
  }
  if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 1) != 0)) {
    iVar32 = QMenuPrivate::scrollerHeight(this_00);
    if ((this_00->field_0x421 & 2) != 0) {
      pQVar16 = QWidget::style(&this->super_QWidget);
      iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1f,0,this);
      iVar32 = iVar32 + iVar11;
    }
    pQVar1 = (this_00->actionRects).d.ptr;
    if ((iVar15 - iVar32) + this_00->scroll->scrollOffset <=
        (pQVar1[(int)uVar24].y2.m_i - pQVar1[(int)uVar24].y1.m_i) + 1) {
      SVar29 = ScrollTop;
    }
  }
  if (pQVar17 == (QAction *)0x0) {
LAB_004262af:
    if ((*(uint *)&this_00->field_0x420 >> 9 & 1) != 0) {
      *(ushort *)&this_00->field_0x420 = (ushort)*(uint *)&this_00->field_0x420 | 0x800;
    }
    goto LAB_00426c9d;
  }
  goto LAB_004263bc;
}

Assistant:

void QMenu::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
#ifndef Q_OS_MAC
    if (key == Qt::Key_Tab) //means down
        key = Qt::Key_Down;
    if (key == Qt::Key_Backtab) //means up
        key = Qt::Key_Up;
#endif

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Home:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        break;
    case Qt::Key_End:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        break;
    case Qt::Key_PageUp:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollUp, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        }
        break;
    case Qt::Key_PageDown:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollDown, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        }
        break;
    case Qt::Key_Up:
    case Qt::Key_Down: {
        key_consumed = true;
        QAction *nextAction = nullptr;
        QMenuPrivate::QMenuScroller::ScrollLocation scroll_loc = QMenuPrivate::QMenuScroller::ScrollStay;
        if (!d->currentAction) {
            if (key == Qt::Key_Down) {
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            } else {
                for(int i = d->actions.size()-1; i >= 0; --i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            }
        } else {
            for(int i = 0, y = 0; !nextAction && i < d->actions.size(); i++) {
                QAction *act = d->actions.at(i);
                if (act == d->currentAction) {
                    if (key == Qt::Key_Up) {
                        for(int next_i = i-1; true; next_i--) {
                            if (next_i == -1) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                                next_i = d->actionRects.size()-1;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)) {
                                int topVisible = d->scrollerHeight();
                                if (d->tearoff)
                                    topVisible += style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if (((y + d->scroll->scrollOffset) - topVisible) <= d->actionRects.at(next_i).height())
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                            }
                            break;
                        }
                        if (!nextAction && d->tearoff)
                            d->tearoffHighlighted = 1;
                    } else {
                        y += d->actionRects.at(i).height();
                        for(int next_i = i+1; true; next_i++) {
                            if (next_i == d->actionRects.size()) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                                next_i = 0;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)) {
                                int bottomVisible = height() - d->scrollerHeight();
                                if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                                    bottomVisible -= d->scrollerHeight();
                                if (d->tearoff)
                                    bottomVisible -= style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if ((y + d->scroll->scrollOffset + d->actionRects.at(next_i).height()) > bottomVisible)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                            }
                            break;
                        }
                    }
                    break;
                }
                y += d->actionRects.at(i).height();
            }
        }
        if (nextAction) {
            if (d->scroll && scroll_loc != QMenuPrivate::QMenuScroller::ScrollStay) {
                d->scroll->scrollTimer.stop();
                d->scrollMenu(nextAction, scroll_loc);
            }
            d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
        }
        break; }

    case Qt::Key_Right:
        if (d->currentAction && d->currentAction->isEnabled() && d->currentAction->menu()) {
            d->popupAction(d->currentAction, 0, true);
            key_consumed = true;
            break;
        }
        Q_FALLTHROUGH();
    case Qt::Key_Left: {
        if (d->currentAction && !d->scroll) {
            QAction *nextAction = nullptr;
            if (key == Qt::Key_Left) {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.left()-1; !nextAction && x >= 0; x--)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            } else {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.right()+1; !nextAction && x < width(); x++)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            }
            if (nextAction) {
                d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                key_consumed = true;
            }
        }
        if (!key_consumed && key == Qt::Key_Left && qobject_cast<QMenu*>(d->causedPopup.widget)) {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this);
            if (caused)
                caused->setFocus();
            key_consumed = true;
        }
        break; }

    case Qt::Key_Alt:
        if (d->tornoff)
            break;

        key_consumed = true;
        if (style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this))
        {
            d->hideMenu(this);
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(QApplication::focusWidget())) {
                mb->d_func()->setKeyboardMode(false);
            }
#endif
        }
        break;

    case Qt::Key_Space:
        if (!style()->styleHint(QStyle::SH_Menu_SpaceActivatesItem, nullptr, this))
            break;
        // for motif, fall through
        Q_FALLTHROUGH();
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
#endif
    case Qt::Key_Return:
    case Qt::Key_Enter: {
        if (!d->currentAction) {
            d->setFirstActionActive();
            key_consumed = true;
            break;
        }

        d->setSyncAction();

        if (d->currentAction->menu())
            d->popupAction(d->currentAction, 0, true);
        else
            d->activateAction(d->currentAction, QAction::Trigger);
        key_consumed = true;
        break; }

#if QT_CONFIG(whatsthis)
    case Qt::Key_F1:
        if (!d->currentAction || d->currentAction->whatsThis().isNull())
            break;
        QWhatsThis::enterWhatsThisMode();
        d->activateAction(d->currentAction, QAction::Trigger);
        return;
#endif
    default:
        key_consumed = false;
    }

    if (!key_consumed && (
        false
#ifndef QT_NO_SHORTCUT
        || e->matches(QKeySequence::Cancel)
#endif
#ifdef QT_KEYPAD_NAVIGATION
        || e->key() == Qt::Key_Back
#endif
    )) {
        key_consumed = true;
        if (d->tornoff) {
            close();
            return;
        }
        {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this); // hide after getting causedPopup
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(d->menuAction);
                mb->d_func()->setKeyboardMode(true);
            }
#endif
        }
    }

    if (!key_consumed) {                                // send to menu bar
        const Qt::KeyboardModifiers modifiers = e->modifiers();
        if ((!modifiers || modifiers == Qt::AltModifier || modifiers == Qt::ShiftModifier
             || modifiers == Qt::KeypadModifier
             || modifiers == (Qt::KeypadModifier | Qt::AltModifier))
            && e->text().size() == 1) {
            bool activateAction = false;
            QAction *nextAction = nullptr;
            if (style()->styleHint(QStyle::SH_Menu_KeyboardSearch, nullptr, this) && !e->modifiers()) {
                int best_match_count = 0;
                d->searchBufferTimer.start(2000, this);
                d->searchBuffer += e->text();
                for(int i = 0; i < d->actions.size(); ++i) {
                    int match_count = 0;
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    const QString act_text = act->text();
                    for(int c = 0; c < d->searchBuffer.size(); ++c) {
                        if (act_text.indexOf(d->searchBuffer.at(c), 0, Qt::CaseInsensitive) != -1)
                            ++match_count;
                    }
                    if (match_count > best_match_count) {
                        best_match_count = match_count;
                        nextAction = act;
                    }
                }
            }
#ifndef QT_NO_SHORTCUT
            else {
                int clashCount = 0;
                QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
                QChar c = e->text().at(0).toUpper();
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (!act->isEnabled() || act->isSeparator())
                        continue;
                    QKeySequence sequence = QKeySequence::mnemonic(act->text());
                    int key = sequence[0].toCombined() & 0xffff; // suspicious
                    if (key == c.unicode()) {
                        clashCount++;
                        if (!first)
                            first = act;
                        if (act == d->currentAction)
                            currentSelected = act;
                        else if (!firstAfterCurrent && currentSelected)
                            firstAfterCurrent = act;
                    }
                }
                if (clashCount == 1)
                    activateAction = true;
                if (clashCount >= 1) {
                    if (clashCount == 1 || !currentSelected || !firstAfterCurrent)
                        nextAction = first;
                    else
                        nextAction = firstAfterCurrent;
                }
            }
#endif
            if (nextAction) {
                key_consumed = true;
                if (d->scroll)
                    d->scrollMenu(nextAction, QMenuPrivate::QMenuScroller::ScrollCenter, false);
                d->setCurrentAction(nextAction, 0, QMenuPrivate::SelectedFromElsewhere, true);
                if (!nextAction->menu() && activateAction) {
                    d->setSyncAction();
                    d->activateAction(nextAction, QAction::Trigger);
                }
            }
        }
        if (!key_consumed) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->topCausedWidget())) {
                QAction *oldAct = mb->d_func()->currentAction;
                QCoreApplication::sendEvent(mb, e);
                if (mb->d_func()->currentAction != oldAct)
                    key_consumed = true;
            }
#endif
        }

#ifdef Q_OS_WIN32
        if (key_consumed && (e->key() == Qt::Key_Control || e->key() == Qt::Key_Shift || e->key() == Qt::Key_Meta))
            QApplication::beep();
#endif // Q_OS_WIN32
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}